

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDScanner.cpp
# Opt level: O2

bool __thiscall
xercesc_4_0::DTDScanner::scanAttValue
          (DTDScanner *this,XMLCh *attrName,XMLBuffer *toFill,AttTypes type)

{
  XMLByte XVar1;
  ulong uVar2;
  ulong uVar3;
  XMLByte *pXVar4;
  bool bVar5;
  int iVar6;
  bool bVar7;
  EntityExpRes EVar8;
  ulong uVar9;
  undefined7 uVar10;
  UnexpectedEOFException *this_00;
  XMLCh toAppend;
  byte bVar12;
  bool escaped;
  XMLCh nextCh;
  int local_74;
  XMLCh secondCh;
  int local_6c;
  XMLCh quoteCh;
  AttTypes local_64;
  ulong local_60;
  XMLBuffer *local_58;
  XMLCh *local_50;
  XMLCh tmpBuf [9];
  uint uVar11;
  
  toFill->fIndex = 0;
  local_64 = type;
  bVar7 = ReaderMgr::skipIfQuote(this->fReaderMgr,&quoteCh);
  if (!bVar7) {
    return false;
  }
  uVar2 = this->fReaderMgr->fCurReader->fReaderNum;
  secondCh = L'\0';
  local_74 = 1;
  local_60 = 0;
  iVar6 = local_74;
  local_58 = toFill;
  local_50 = attrName;
  bVar7 = false;
LAB_002f8344:
  bVar5 = bVar7;
  local_6c = iVar6;
  nextCh = ReaderMgr::getNextChar(this->fReaderMgr);
  uVar9 = (ulong)(ushort)nextCh;
  uVar11 = (uint)(ushort)nextCh;
  if (nextCh == L'\0') {
    this_00 = (UnexpectedEOFException *)__cxa_allocate_exception(0x30);
    UnexpectedEOFException::UnexpectedEOFException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/DTD/DTDScanner.cpp"
               ,0x313,Gen_UnexpectedEOF,this->fMemoryManager);
    __cxa_throw(this_00,&UnexpectedEOFException::typeinfo,XMLException::~XMLException);
  }
  if (nextCh == quoteCh) {
    uVar3 = this->fReaderMgr->fCurReader->fReaderNum;
    bVar7 = uVar2 == uVar3;
    if (bVar7) {
      return bVar7;
    }
    if (uVar3 <= uVar2 && !bVar7) {
      XMLScanner::emitError(this->fScanner,PartialMarkupInEntity);
      return bVar7;
    }
  }
  escaped = false;
  if (nextCh == L'&') goto code_r0x002f8393;
  if ((nextCh & 0xfc00U) != 0xd800) {
    if (bVar5) {
      if (0xfbff < (ushort)(nextCh + L'\x2000')) {
        bVar7 = false;
        goto LAB_002f84a8;
      }
      bVar12 = 0;
      XMLScanner::emitError(this->fScanner,Expected2ndSurrogateChar);
      bVar5 = false;
    }
    else {
      if ((this->fReaderMgr->fCurReader->fgCharCharsTable[(ushort)nextCh] & 0x40) == 0) {
        XMLString::binToText((uint)(ushort)nextCh,tmpBuf,8,0x10,this->fMemoryManager);
        XMLScanner::emitError
                  (this->fScanner,InvalidCharacterInAttrValue,local_50,tmpBuf,(XMLCh *)0x0,
                   (XMLCh *)0x0);
      }
      bVar12 = 0;
      bVar5 = false;
    }
    goto LAB_002f8473;
  }
  bVar7 = true;
  if (bVar5) {
    XMLScanner::emitError(this->fScanner,Expected2ndSurrogateChar);
    bVar7 = bVar5;
  }
LAB_002f84a8:
  if (local_64 == AttTypes_Min) goto LAB_002f8512;
  goto LAB_002f84b2;
code_r0x002f8393:
  EVar8 = scanEntityRef(this,&nextCh,&secondCh,&escaped);
  iVar6 = local_6c;
  bVar7 = false;
  if (EVar8 == EntityExp_Returned) {
    uVar9 = (ulong)(ushort)nextCh;
    bVar12 = escaped;
LAB_002f8473:
    uVar11 = (uint)uVar9;
    toAppend = (XMLCh)uVar9;
    if (toAppend == L'<' && (bVar12 & 1) == 0) {
      XMLScanner::emitError
                (this->fScanner,BracketInAttrValue,local_50,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
    }
    bVar7 = bVar5;
    if (local_64 == AttTypes_Min) {
      if ((bVar12 & 1) == 0) {
LAB_002f8512:
        toAppend = (XMLCh)uVar11;
        if (((ushort)toAppend < 0xe) && ((0x2600U >> (uVar11 & 0x1f) & 1) != 0)) {
          nextCh = L' ';
          toAppend = L' ';
        }
      }
    }
    else {
LAB_002f84b2:
      pXVar4 = this->fReaderMgr->fCurReader->fgCharCharsTable;
      toAppend = (XMLCh)uVar9;
      XVar1 = pXVar4[uVar9];
      uVar10 = (undefined7)((ulong)pXVar4 >> 8);
      if (local_6c == 0) {
        iVar6 = 0;
        if ((char)XVar1 < '\0') goto LAB_002f8344;
        if ((local_60 & 1) == 0) {
          local_74 = 1;
          local_60 = 1;
        }
        else {
          local_60 = CONCAT71(uVar10,1);
          XMLBuffer::append(local_58,L' ');
          local_74 = 1;
        }
      }
      else {
        iVar6 = 0;
        if ((char)XVar1 < '\0') goto LAB_002f8344;
        local_60 = CONCAT71(uVar10,1);
        local_74 = 1;
      }
    }
    XMLBuffer::append(local_58,toAppend);
    iVar6 = local_74;
    if (secondCh != L'\0') {
      XMLBuffer::append(local_58,secondCh);
      secondCh = L'\0';
      iVar6 = local_74;
    }
  }
  goto LAB_002f8344;
}

Assistant:

bool DTDScanner::scanAttValue(const   XMLCh* const        attrName
                                ,       XMLBuffer&          toFill
                                , const XMLAttDef::AttTypes type)
{
    enum States
    {
        InWhitespace
        , InContent
    };

    // Reset the target buffer
    toFill.reset();

    // Get the next char which must be a single or double quote
    XMLCh quoteCh;
    if (!fReaderMgr->skipIfQuote(quoteCh))
        return false;

    //
    //  We have to get the current reader because we have to ignore closing
    //  quotes until we hit the same reader again.
    //
    const XMLSize_t curReader = fReaderMgr->getCurrentReaderNum();

    //
    //  Loop until we get the attribute value. Note that we use a double
    //  loop here to avoid the setup/teardown overhead of the exception
    //  handler on every round.
    //
    XMLCh   nextCh;
    XMLCh   secondCh = 0;
    States  curState = InContent;
    bool    firstNonWS = false;
    bool    gotLeadingSurrogate = false;
    bool    escaped;
    while (true)
    {
    try
    {
        while(true)
        {
            nextCh = fReaderMgr->getNextChar();

            if (!nextCh)
                ThrowXMLwithMemMgr(UnexpectedEOFException, XMLExcepts::Gen_UnexpectedEOF, fMemoryManager);

            // Check for our ending quote in the same entity
            if (nextCh == quoteCh)
            {
                if (curReader == fReaderMgr->getCurrentReaderNum())
                    return true;

                // Watch for spillover into a previous entity
                if (curReader > fReaderMgr->getCurrentReaderNum())
                {
                    fScanner->emitError(XMLErrs::PartialMarkupInEntity);
                    return false;
                }
            }

            //
            //  Check for an entity ref now, before we let it affect our
            //  whitespace normalization logic below. We ignore the empty flag
            //  in this one.
            //
            escaped = false;
            if (nextCh == chAmpersand)
            {
                if (scanEntityRef(nextCh, secondCh, escaped) != EntityExp_Returned)
                {
                    gotLeadingSurrogate = false;
                    continue;
                }
            }
            else if ((nextCh >= 0xD800) && (nextCh <= 0xDBFF))
            {
                // Check for correct surrogate pairs
                if (gotLeadingSurrogate)
                    fScanner->emitError(XMLErrs::Expected2ndSurrogateChar);
                else
                    gotLeadingSurrogate = true;
            }
             else
            {
                if (gotLeadingSurrogate)
                {
                    if ((nextCh < 0xDC00) || (nextCh > 0xDFFF))
                        fScanner->emitError(XMLErrs::Expected2ndSurrogateChar);
                }
                // Its got to at least be a valid XML character
                else if (!fReaderMgr->getCurrentReader()->isXMLChar(nextCh))
                {
                    XMLCh tmpBuf[9];
                    XMLString::binToText
                    (
                        nextCh
                        , tmpBuf
                        , 8
                        , 16
                        , fMemoryManager
                    );
                    fScanner->emitError
                    (
                        XMLErrs::InvalidCharacterInAttrValue
                        , attrName
                        , tmpBuf
                    );
                }

                gotLeadingSurrogate = false;
            }

            //
            //  If its not escaped, then make sure its not a < character, which
            //  is not allowed in attribute values.
            //
            if (!escaped && (nextCh == chOpenAngle))
                fScanner->emitError(XMLErrs::BracketInAttrValue, attrName);

            //
            //  If the attribute is a CDATA type we do simple replacement of
            //  tabs and new lines with spaces, if the character is not escaped
            //  by way of a char ref.
            //
            //  Otherwise, we do the standard non-CDATA normalization of
            //  compressing whitespace to single spaces and getting rid of
            //  leading and trailing whitespace.
            //
            if (type == XMLAttDef::CData)
            {
                if (!escaped)
                {
                    if ((nextCh == 0x09) || (nextCh == 0x0A) || (nextCh == 0x0D))
                        nextCh = chSpace;
                }
            }
             else
            {
                if (curState == InWhitespace)
                {
                    if (!fReaderMgr->getCurrentReader()->isWhitespace(nextCh))
                    {
                        if (firstNonWS)
                            toFill.append(chSpace);
                        curState = InContent;
                        firstNonWS = true;
                    }
                     else
                    {
                        continue;
                    }
                }
                 else if (curState == InContent)
                {
                    if (fReaderMgr->getCurrentReader()->isWhitespace(nextCh))
                    {
                        curState = InWhitespace;
                        continue;
                    }
                    firstNonWS = true;
                }
            }

            // Else add it to the buffer
            toFill.append(nextCh);

            if (secondCh)
            {
                toFill.append(secondCh);
                secondCh=0;
            }
        }
    }

    catch(const EndOfEntityException&)
    {
        // Just eat it and continue.
        gotLeadingSurrogate = false;
        escaped = false;
    }
    }
    return true;
}